

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImVec2 pos_00;
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  char *text;
  bool bVar3;
  bool bVar4;
  ImGuiID IVar5;
  ImU32 IVar6;
  ImU32 col;
  uint uVar7;
  undefined7 extraout_var;
  ImGuiWindow *pIVar8;
  byte bVar9;
  char cVar10;
  ImDrawFlags IVar12;
  ImGuiContext *g;
  uint uVar13;
  float fVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar15;
  float fVar16;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImRect r_outer;
  ImVec2 size_expected;
  ImVec2 pos;
  ImRect total_bb;
  bool local_105;
  float local_104;
  undefined4 local_100;
  bool local_f9;
  ImRect local_f8;
  ImGuiID local_dc;
  ImVec2 local_d8 [2];
  undefined1 local_c8 [16];
  ImGuiID local_b8;
  uint local_b4;
  char *local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [24];
  char *local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImRect local_40;
  undefined4 uVar11;
  
  pIVar2 = GImGui;
  uVar13 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar13 & 0xffffffef;
  pIVar8 = pIVar2->CurrentWindow;
  pIVar8->WriteAccessed = true;
  if (pIVar8->SkipItems == false) {
    local_b0 = preview_value;
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x61c,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    IVar5 = ImGuiWindow::GetID(pIVar8,label,(char *)0x0);
    local_104 = 0.0;
    if ((flags & 0x20U) == 0) {
      local_104 = GetFrameHeight();
    }
    IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_98._8_4_ = extraout_XMM0_Dc;
    local_98._0_4_ = IVar1.x;
    local_98._4_4_ = IVar1.y;
    local_98._12_4_ = extraout_XMM0_Dd;
    fVar14 = CalcItemWidth();
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0;
    local_a8 = local_104;
    if ((flags & 0x40U) == 0) {
      local_a8 = fVar14;
      uStack_a4 = extraout_XMM0_Db;
      uStack_a0 = extraout_XMM0_Dc_00;
      uStack_9c = extraout_XMM0_Dd_00;
    }
    fVar14 = (pIVar2->Style).FramePadding.y;
    local_f8.Max.x = (pIVar8->DC).CursorPos.x + local_a8;
    fVar15 = fVar14 + fVar14 + (float)local_98._4_4_ + (pIVar8->DC).CursorPos.y;
    local_f8.Max.y = fVar15;
    local_f8.Min = (pIVar8->DC).CursorPos;
    fVar16 = 0.0;
    if (0.0 < (float)local_98._0_4_) {
      fVar16 = (pIVar2->Style).ItemInnerSpacing.x + (float)local_98._0_4_;
    }
    local_40.Max.y = fVar15 + 0.0;
    local_40.Max.x = fVar16 + local_f8.Max.x;
    local_dc = IVar5;
    local_b4 = uVar13;
    local_80 = label;
    local_40.Min = local_f8.Min;
    ItemSize(&local_40,fVar14);
    IVar5 = local_dc;
    bVar3 = ItemAdd(&local_40,local_dc,&local_f8,0);
    cVar10 = '\0';
    if (bVar3) {
      bVar3 = ButtonBehavior(&local_f8,IVar5,&local_105,&local_f9,0);
      local_b8 = ImHashStr("##ComboPopup",0,IVar5);
      bVar4 = IsPopupOpen(local_b8,0);
      local_100 = (undefined4)CONCAT71(extraout_var,bVar4);
      IVar6 = GetColorU32(local_105 + 7,1.0);
      local_c8 = ZEXT416((uint)local_f8.Min.x);
      local_58 = ZEXT416((uint)local_f8.Max.x);
      RenderNavHighlight(&local_f8,IVar5,1);
      uVar13 = -(uint)((float)local_58._0_4_ - local_104 <= (float)local_c8._0_4_);
      local_c8._0_4_ = uVar13 & local_c8._0_4_ | ~uVar13 & (uint)((float)local_58._0_4_ - local_104)
      ;
      local_c8._4_4_ = local_58._4_4_ & local_c8._4_4_;
      local_c8._8_4_ = local_58._8_4_ & local_c8._8_4_;
      local_c8._12_4_ = local_58._12_4_ & local_c8._12_4_;
      if ((flags & 0x40U) == 0) {
        local_d8[0].y = local_f8.Max.y;
        local_d8[0].x = (float)local_c8._0_4_;
        IVar12 = 0xf0;
        if ((flags & 0x20U) == 0) {
          IVar12 = 0x50;
        }
        ImDrawList::AddRectFilled
                  (pIVar8->DrawList,&local_f8.Min,local_d8,IVar6,(pIVar2->Style).FrameRounding,
                   IVar12);
      }
      if ((flags & 0x20U) == 0) {
        IVar6 = GetColorU32(((local_105 | (byte)local_100) & 1) + 0x15,1.0);
        col = GetColorU32(0,1.0);
        local_d8[0].y = local_f8.Min.y;
        local_d8[0].x = (float)local_c8._0_4_;
        IVar12 = 0xa0;
        if (local_a8 <= local_104) {
          IVar12 = 0xf0;
        }
        ImDrawList::AddRectFilled
                  (pIVar8->DrawList,local_d8,&local_f8.Max,IVar6,(pIVar2->Style).FrameRounding,
                   IVar12);
        if ((local_104 + (float)local_c8._0_4_) - (pIVar2->Style).FramePadding.x <= local_f8.Max.x)
        {
          fVar14 = (pIVar2->Style).FramePadding.y;
          IVar1.y = fVar14 + local_f8.Min.y;
          IVar1.x = (float)local_c8._0_4_ + fVar14;
          RenderArrow(pIVar8->DrawList,IVar1,col,3,1.0);
        }
      }
      RenderFrameBorder(local_f8.Min,local_f8.Max,(pIVar2->Style).FrameRounding);
      text = local_80;
      IVar5 = local_dc;
      if (local_b0 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
        local_d8[0].y = local_f8.Min.y + (pIVar2->Style).FramePadding.y;
        local_d8[0].x = local_f8.Min.x + (pIVar2->Style).FramePadding.x;
        if (pIVar2->LogEnabled == true) {
          LogSetNextTextDecoration("{","}");
        }
        local_70.Min.y = local_f8.Max.y;
        local_70.Min.x = (float)local_c8._0_4_;
        local_60.x = 0.0;
        local_60.y = 0.0;
        RenderTextClipped(local_d8,&local_70.Min,local_b0,(char *)0x0,(ImVec2 *)0x0,&local_60,
                          (ImRect *)0x0);
      }
      if (0.0 < (float)local_98._0_4_) {
        pos_00.y = local_f8.Min.y + (pIVar2->Style).FramePadding.y;
        pos_00.x = local_f8.Max.x + (pIVar2->Style).ItemInnerSpacing.x;
        RenderText(pos_00,text,(char *)0x0,true);
      }
      bVar9 = (byte)local_100;
      if (!bVar3) {
        bVar9 = bVar9 | pIVar2->NavActivateId != IVar5;
      }
      uVar11 = local_100;
      if (bVar9 == 0) {
        if ((pIVar8->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
          pIVar8->NavLastIds[0] = IVar5;
        }
        OpenPopupEx(local_b8,0);
        uVar11 = 1;
      }
      cVar10 = (char)uVar11;
      if (cVar10 != '\0') {
        if ((local_b4 & 0x10) == 0) {
          uVar13 = flags | 4;
          if ((flags & 0x1eU) != 0) {
            uVar13 = flags;
          }
          uVar7 = (uVar13 & 0x1e) - 1;
          if ((uVar13 & 0x1e ^ uVar7) <= uVar7) {
            __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                          ,0x65d,
                          "bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
          }
          uVar7 = 8;
          if (((uVar13 & 4) == 0) && (uVar7 = 4, (uVar13 & 2) == 0)) {
            uVar7 = -(uint)((uVar13 & 8) == 0) | 0x14;
          }
          local_d8[0].y = 0.0;
          local_d8[0].x = local_a8;
          if ((int)uVar7 < 1) {
            fVar14 = 3.4028235e+38;
          }
          else {
            fVar14 = (GImGui->Style).WindowPadding.y;
            fVar15 = (GImGui->Style).ItemSpacing.y;
            fVar14 = fVar14 + fVar14 + ((float)(int)uVar7 * (GImGui->FontSize + fVar15) - fVar15);
          }
          local_70.Min.y = fVar14;
          local_70.Min.x = 3.4028235e+38;
          SetNextWindowSizeConstraints(local_d8,&local_70.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
          flags = uVar13;
        }
        else {
          *(byte *)&(pIVar2->NextWindowData).Flags = (byte)(pIVar2->NextWindowData).Flags | 0x10;
          fVar14 = (pIVar2->NextWindowData).SizeConstraintRect.Min.x;
          uVar13 = -(uint)(local_a8 <= fVar14);
          (pIVar2->NextWindowData).SizeConstraintRect.Min.x =
               (float)(~uVar13 & (uint)local_a8 | (uint)fVar14 & uVar13);
        }
        ImFormatString((char *)local_d8,0x10,"##Combo_%02d",
                       (ulong)(uint)(pIVar2->BeginPopupStack).Size);
        pIVar8 = FindWindowByName((char *)local_d8);
        if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->WasActive == true)) {
          local_60 = CalcWindowNextAutoFitSize(pIVar8);
          pIVar8->AutoPosLastDirection = (uint)((flags & 1U) == 0) * 3;
          local_70 = GetWindowAllowedExtentRect(pIVar8);
          local_78.y = local_f8.Max.y;
          local_78.x = local_f8.Min.x;
          local_48 = FindBestWindowPosForPopupEx
                               (&local_78,&local_60,&pIVar8->AutoPosLastDirection,&local_70,
                                &local_f8,ImGuiPopupPositionPolicy_ComboBox);
          local_78.x = 0.0;
          local_78.y = 0.0;
          SetNextWindowPos(&local_48,0,&local_78);
        }
        local_70.Min.y = (pIVar2->Style).WindowPadding.y;
        local_70.Min.x = (pIVar2->Style).FramePadding.x;
        PushStyleVar(1,&local_70.Min);
        bVar3 = Begin((char *)local_d8,(bool *)0x0,0x4000147);
        PopStyleVar(1);
        if (!bVar3) {
          EndPopup();
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                        ,0x682,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)"
                       );
        }
      }
    }
  }
  else {
    cVar10 = '\0';
  }
  return (bool)cVar10;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);

    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        ImVec2 preview_pos = frame_bb.Min + style.FramePadding;
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(preview_pos, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f, 0.0f));
    }
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Position the window given a custom constraint (peak into expected window size so we can position it)
    // This might be easier to express with an hypothetical SetNextWindowPosConstraints() function.
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left; // "Below, Toward Left"
            else
                popup_window->AutoPosLastDirection = ImGuiDir_Down; // "Below, Toward Right (default)"
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}